

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_huge_timeout(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_timer_t *puVar2;
  undefined8 uVar3;
  undefined8 unaff_RBX;
  undefined1 auStack_c0 [152];
  code *pcStack_28;
  code *pcStack_20;
  code *pcStack_18;
  code *pcStack_10;
  
  pcStack_10 = (code *)0x177471;
  puVar2 = (uv_timer_t *)uv_default_loop();
  pcStack_10 = (code *)0x177480;
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_10 = (code *)0x17748d;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x17749c;
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    if (iVar1 != 0) goto LAB_00177575;
    pcStack_10 = (code *)0x1774a9;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x1774b8;
    iVar1 = uv_timer_init(puVar2,&huge_timer2);
    if (iVar1 != 0) goto LAB_0017757a;
    puVar2 = &tiny_timer;
    pcStack_10 = (code *)0x1774da;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0017757f;
    puVar2 = &huge_timer1;
    pcStack_10 = (code *)0x177501;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    if (iVar1 != 0) goto LAB_00177584;
    puVar2 = &huge_timer2;
    pcStack_10 = (code *)0x177521;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    if (iVar1 != 0) goto LAB_00177589;
    pcStack_10 = (code *)0x17752a;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x177534;
    iVar1 = uv_run(puVar2,0);
    if (iVar1 != 0) goto LAB_0017758e;
    pcStack_10 = (code *)0x17753d;
    unaff_RBX = uv_default_loop();
    pcStack_10 = (code *)0x177551;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_10 = (code *)0x17755b;
    uv_run(unaff_RBX,0);
    pcStack_10 = (code *)0x177560;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x177568;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_10 = (code *)0x177575;
    run_test_timer_huge_timeout_cold_1();
LAB_00177575:
    pcStack_10 = (code *)0x17757a;
    run_test_timer_huge_timeout_cold_2();
LAB_0017757a:
    pcStack_10 = (code *)0x17757f;
    run_test_timer_huge_timeout_cold_3();
LAB_0017757f:
    pcStack_10 = (code *)0x177584;
    run_test_timer_huge_timeout_cold_4();
LAB_00177584:
    pcStack_10 = (code *)0x177589;
    run_test_timer_huge_timeout_cold_5();
LAB_00177589:
    pcStack_10 = (code *)0x17758e;
    run_test_timer_huge_timeout_cold_6();
LAB_0017758e:
    pcStack_10 = (code *)0x177593;
    run_test_timer_huge_timeout_cold_7();
  }
  pcStack_10 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_8();
  if (puVar2 == &tiny_timer) {
    pcStack_18 = (code *)0x1775b3;
    uv_close(&tiny_timer,0);
    pcStack_18 = (code *)0x1775c1;
    uv_close(&huge_timer1,0);
    iVar1 = uv_close(&huge_timer2,0);
    return iVar1;
  }
  pcStack_18 = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_20 = (code *)0x1775db;
  pcStack_18 = (code *)unaff_RBX;
  puVar2 = (uv_timer_t *)uv_default_loop();
  pcStack_20 = (code *)0x1775ea;
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_20 = (code *)0x1775f7;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_20 = (code *)0x177606;
    iVar1 = uv_timer_init(puVar2,&huge_timer1);
    if (iVar1 != 0) goto LAB_001776a2;
    puVar2 = &tiny_timer;
    pcStack_20 = (code *)0x17762b;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    if (iVar1 != 0) goto LAB_001776a7;
    puVar2 = &huge_timer1;
    pcStack_20 = (code *)0x17764e;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_001776ac;
    pcStack_20 = (code *)0x177657;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_20 = (code *)0x177661;
    iVar1 = uv_run(puVar2,0);
    if (iVar1 != 0) goto LAB_001776b1;
    pcStack_20 = (code *)0x17766a;
    unaff_RBX = uv_default_loop();
    pcStack_20 = (code *)0x17767e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_20 = (code *)0x177688;
    uv_run(unaff_RBX,0);
    pcStack_20 = (code *)0x17768d;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_20 = (code *)0x177695;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_20 = (code *)0x1776a2;
    run_test_timer_huge_repeat_cold_1();
LAB_001776a2:
    pcStack_20 = (code *)0x1776a7;
    run_test_timer_huge_repeat_cold_2();
LAB_001776a7:
    pcStack_20 = (code *)0x1776ac;
    run_test_timer_huge_repeat_cold_3();
LAB_001776ac:
    pcStack_20 = (code *)0x1776b1;
    run_test_timer_huge_repeat_cold_4();
LAB_001776b1:
    pcStack_20 = (code *)0x1776b6;
    run_test_timer_huge_repeat_cold_5();
  }
  pcStack_20 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  iVar1 = huge_repeat_cb::ncalls;
  pcStack_20._0_4_ = extraout_EAX;
  if (huge_repeat_cb::ncalls != 0) {
    if (puVar2 == &tiny_timer) goto LAB_001776e3;
    pcStack_28 = (code *)0x1776d7;
    huge_repeat_cb_cold_1();
    iVar1 = extraout_EAX_00;
  }
  if (puVar2 == &huge_timer1) {
LAB_001776e3:
    huge_repeat_cb::ncalls = iVar1 + 1;
    if (huge_repeat_cb::ncalls == 10) {
      pcStack_28 = (code *)0x1776fe;
      uv_close(&tiny_timer,0);
      iVar1 = uv_close(&huge_timer1,0);
      return iVar1;
    }
    return (int)pcStack_20;
  }
  pcStack_28 = run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  pcStack_28 = (code *)unaff_RBX;
  uVar3 = uv_default_loop();
  iVar1 = uv_timer_init(uVar3,auStack_c0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_c0,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_00177823;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,1);
    if (iVar1 != 0) goto LAB_00177828;
    if (timer_run_once_timer_cb_called != 1) goto LAB_0017782d;
    iVar1 = uv_timer_start(auStack_c0,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00177832;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,1);
    if (iVar1 != 0) goto LAB_00177837;
    if (timer_run_once_timer_cb_called != 2) goto LAB_0017783c;
    uv_close(auStack_c0,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,1);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00177846;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_00177823:
    run_test_timer_run_once_cold_2();
LAB_00177828:
    run_test_timer_run_once_cold_3();
LAB_0017782d:
    run_test_timer_run_once_cold_4();
LAB_00177832:
    run_test_timer_run_once_cold_5();
LAB_00177837:
    run_test_timer_run_once_cold_6();
LAB_0017783c:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_00177846:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(timer_huge_timeout) {
  ASSERT(0 == uv_timer_init(uv_default_loop(), &tiny_timer));
  ASSERT(0 == uv_timer_init(uv_default_loop(), &huge_timer1));
  ASSERT(0 == uv_timer_init(uv_default_loop(), &huge_timer2));
  ASSERT(0 == uv_timer_start(&tiny_timer, tiny_timer_cb, 1, 0));
  ASSERT(0 == uv_timer_start(&huge_timer1, tiny_timer_cb, 0xffffffffffffLL, 0));
  ASSERT(0 == uv_timer_start(&huge_timer2, tiny_timer_cb, (uint64_t) -1, 0));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY();
  return 0;
}